

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

AssertionItemPortListSyntax * __thiscall
slang::parsing::Parser::parseAssertionItemPortList(Parser *this,SyntaxKind parentKind)

{
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements;
  Token closeParen_00;
  Token openParen_00;
  bool bVar1;
  EVP_PKEY_CTX *src;
  Info *extraout_RDX;
  undefined8 *in_RDI;
  Token closeParen;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> buffer;
  Token openParen;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffe7c;
  Token *in_stack_fffffffffffffe80;
  SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax> *this_00;
  undefined4 uVar3;
  undefined2 in_stack_fffffffffffffe8c;
  TokenKind in_stack_fffffffffffffe8e;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe90;
  undefined8 *puVar4;
  ParserBase *in_stack_fffffffffffffea0;
  Info *pIVar5;
  undefined1 local_d0 [100];
  RequireItems in_stack_ffffffffffffff94;
  Token *in_stack_ffffffffffffff98;
  TokenKind in_stack_ffffffffffffffa4;
  TokenKind in_stack_ffffffffffffffa6;
  SmallVectorBase<slang::syntax::TokenOrSyntax> *in_stack_ffffffffffffffa8;
  ParserBase *in_stack_ffffffffffffffb0;
  DiagCode in_stack_ffffffffffffffc0;
  anon_class_16_2_75193fd9 *in_stack_ffffffffffffffc8;
  AllowEmpty in_stack_ffffffffffffffd0;
  AssertionItemPortListSyntax *local_8;
  
  bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffe90._M_extent_value,
                           in_stack_fffffffffffffe8e);
  if (bVar1) {
    ParserBase::consume(in_stack_fffffffffffffea0);
    SmallVector<slang::syntax::TokenOrSyntax,_4UL>::SmallVector
              ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x8b3269);
    Token::Token(in_stack_fffffffffffffe80);
    local_d0._16_4_ = 0x2e0005;
    this_00 = (SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax> *)local_d0;
    uVar2 = 0x2e0005;
    uVar3 = 0;
    ParserBase::
    parseList<&slang::syntax::SyntaxFacts::isPossiblePropertyPortItem,&slang::syntax::SyntaxFacts::isEndOfParenList,slang::parsing::Parser::parseAssertionItemPortList(slang::syntax::SyntaxKind)::__0>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa6,
               in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
               in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd0);
    puVar4 = in_RDI + 0x1c;
    SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
              ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)(local_d0 + 0x30),
               (EVP_PKEY_CTX *)*in_RDI,src);
    elements._M_ptr._4_2_ = in_stack_fffffffffffffe8c;
    elements._M_ptr._0_4_ = uVar3;
    elements._M_ptr._6_2_ = in_stack_fffffffffffffe8e;
    elements._M_extent._M_extent_value = in_stack_fffffffffffffe90._M_extent_value;
    pIVar5 = extraout_RDX;
    slang::syntax::SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax>::SeparatedSyntaxList
              (this_00,elements);
    openParen_00.info = pIVar5;
    openParen_00._0_8_ = puVar4;
    closeParen_00.rawLen._0_2_ = in_stack_fffffffffffffe8c;
    closeParen_00.kind = (short)uVar3;
    closeParen_00._2_1_ = (char)((uint)uVar3 >> 0x10);
    closeParen_00.numFlags.raw = (char)((uint)uVar3 >> 0x18);
    closeParen_00.rawLen._2_2_ = in_stack_fffffffffffffe8e;
    closeParen_00.info = (Info *)in_stack_fffffffffffffe90._M_extent_value;
    local_8 = slang::syntax::SyntaxFactory::assertionItemPortList
                        ((SyntaxFactory *)this_00,openParen_00,
                         (SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax> *)
                         CONCAT44(in_stack_fffffffffffffe7c,uVar2),closeParen_00);
    SmallVector<slang::syntax::TokenOrSyntax,_4UL>::~SmallVector
              ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x8b33a2);
  }
  else {
    local_8 = (AssertionItemPortListSyntax *)0x0;
  }
  return local_8;
}

Assistant:

AssertionItemPortListSyntax* Parser::parseAssertionItemPortList(SyntaxKind parentKind) {
    if (!peek(TokenKind::OpenParenthesis))
        return nullptr;

    auto openParen = consume();

    SmallVector<TokenOrSyntax, 4> buffer;
    Token closeParen;
    parseList<isPossiblePropertyPortItem, isEndOfParenList>(
        buffer, TokenKind::CloseParenthesis, TokenKind::Comma, closeParen, RequireItems::False,
        diag::ExpectedAssertionItemPort,
        [this, parentKind] { return &parseAssertionItemPort(parentKind); });

    return &factory.assertionItemPortList(openParen, buffer.copy(alloc), closeParen);
}